

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O3

void __thiscall QNetworkRequest::QNetworkRequest(QNetworkRequest *this)

{
  QNetworkRequestPrivate *pQVar1;
  
  pQVar1 = (QNetworkRequestPrivate *)operator_new(0xa8);
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)0x0;
  (pQVar1->super_QNetworkHeadersPrivate).rawHeaderCache.headersList.d.d = (Data *)0x0;
  (pQVar1->super_QNetworkHeadersPrivate).rawHeaderCache.headersList.d.ptr =
       (pair<QByteArray,_QByteArray> *)0x0;
  *(undefined8 *)
   ((long)&(pQVar1->super_QNetworkHeadersPrivate).rawHeaderCache.headersList.d.ptr + 1) = 0;
  *(undefined8 *)
   ((long)&(pQVar1->super_QNetworkHeadersPrivate).rawHeaderCache.headersList.d.size + 1) = 0;
  QHttpHeaders::QHttpHeaders(&(pQVar1->super_QNetworkHeadersPrivate).httpHeaders);
  (pQVar1->super_QNetworkHeadersPrivate).originatingObject.wp.d = (Data *)0x0;
  (pQVar1->super_QNetworkHeadersPrivate).originatingObject.wp.value = (QObject *)0x0;
  (pQVar1->super_QNetworkHeadersPrivate).cookedHeaders.d = (Data *)0x0;
  (pQVar1->super_QNetworkHeadersPrivate).attributes.d = (Data *)0x0;
  QUrl::QUrl(&pQVar1->url);
  pQVar1->priority = NormalPriority;
  pQVar1->sslConfiguration = (QSslConfiguration *)0x0;
  pQVar1->maxRedirectsAllowed = 0x32;
  (pQVar1->peerVerifyName).d.d = (Data *)0x0;
  (pQVar1->peerVerifyName).d.ptr = (char16_t *)0x0;
  (pQVar1->peerVerifyName).d.size = 0;
  QHttp1Configuration::QHttp1Configuration(&pQVar1->h1Configuration);
  QHttp2Configuration::QHttp2Configuration(&pQVar1->h2Configuration);
  pQVar1->decompressedSafetyCheckThreshold = 0xa00000;
  (pQVar1->transferTimeout).__r = 0;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QNetworkRequest>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QNetworkRequest>::metaType);
  }
  (this->d).d.ptr = pQVar1;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  pQVar1 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QNetworkRequestPrivate>::detach_helper(&this->d);
    pQVar1 = (this->d).d.ptr;
  }
  QHttp2Configuration::setStreamReceiveWindowSize(&pQVar1->h2Configuration,0xccccccc);
  pQVar1 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QNetworkRequestPrivate>::detach_helper(&this->d);
    pQVar1 = (this->d).d.ptr;
  }
  QHttp2Configuration::setSessionReceiveWindowSize(&pQVar1->h2Configuration,0x7fffffff);
  pQVar1 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QNetworkRequestPrivate>::detach_helper(&this->d);
    pQVar1 = (this->d).d.ptr;
  }
  QHttp2Configuration::setServerPushEnabled(&pQVar1->h2Configuration,false);
  return;
}

Assistant:

QNetworkRequest::QNetworkRequest()
    : d(new QNetworkRequestPrivate)
{
#if QT_CONFIG(http)
    // Initial values proposed by RFC 7540 are quite draconian, but we
    // know about servers configured with this value as maximum possible,
    // rejecting our SETTINGS frame and sending us a GOAWAY frame with the
    // flow control error set. If this causes a problem - the app should
    // set a proper configuration. We'll use our defaults, as documented.
    d->h2Configuration.setStreamReceiveWindowSize(Http2::qtDefaultStreamReceiveWindowSize);
    d->h2Configuration.setSessionReceiveWindowSize(Http2::maxSessionReceiveWindowSize);
    d->h2Configuration.setServerPushEnabled(false);
#endif // QT_CONFIG(http)
}